

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

VectorSet<const_llvm::Value_*> * __thiscall
dg::vr::ValueRelations::getValsByPtr
          (VectorSet<const_llvm::Value_*> *__return_storage_ptr__,ValueRelations *this,V from)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  key_type local_10;
  
  p_Var4 = (this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->valToBucket)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      if (*(V *)(p_Var4 + 1) >= from) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(V *)(p_Var4 + 1) < from];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((((_Rb_tree_header *)p_Var2 != p_Var1) && (*(V *)(p_Var2 + 1) <= from)) &&
        (p_Var4 = p_Var2[1]._M_parent, p_Var4 != (_Base_ptr)0x0)) &&
       ((p_Var4[7]._M_right != *(_Base_ptr *)(p_Var4 + 8) &&
        (local_10._M_data = *(Bucket **)p_Var4[7]._M_right, local_10._M_data != (Bucket *)0x0)))) {
      cVar3 = std::
              _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
              ::find(&(this->bucketToVals)._M_t,&local_10);
      std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::vector
                (&__return_storage_ptr__->vec,
                 (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
                 &cVar3._M_node[1]._M_parent);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->vec).
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vec).
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vec).
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

VectorSet<ValueRelations::V> ValueRelations::getValsByPtr(V from) const {
    HandlePtr mH = maybeGet(from);
    if (!mH)
        return {};
    HandlePtr toH = getHandleByPtr(*mH);
    if (!toH)
        return {};
    return getEqual(*toH);
}